

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifMan.c
# Opt level: O3

If_Set_t * If_ManSetupNodeCutSet(If_Man_t *p,If_Obj_t *pObj)

{
  If_Set_t *pIVar1;
  
  if (((undefined1  [112])*pObj & (undefined1  [112])0xf) != (undefined1  [112])0x4) {
    __assert_fail("If_ObjIsAnd(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifMan.c"
                  ,0x255,"If_Set_t *If_ManSetupNodeCutSet(If_Man_t *, If_Obj_t *)");
  }
  if (pObj->pCutSet == (If_Set_t *)0x0) {
    pIVar1 = p->pFreeList;
    p->pFreeList = pIVar1->pNext;
    pObj->pCutSet = pIVar1;
    pIVar1->nCuts = 0;
    pIVar1->nCutsMax = (short)p->pPars->nCutsMax;
    return pIVar1;
  }
  __assert_fail("pObj->pCutSet == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifMan.c"
                ,0x256,"If_Set_t *If_ManSetupNodeCutSet(If_Man_t *, If_Obj_t *)");
}

Assistant:

If_Set_t * If_ManSetupNodeCutSet( If_Man_t * p, If_Obj_t * pObj )
{
    assert( If_ObjIsAnd(pObj) );
    assert( pObj->pCutSet == NULL );
//    pObj->pCutSet = (If_Set_t *)Mem_FixedEntryFetch( p->pMemSet );
//    If_ManSetupSet( p, pObj->pCutSet );
    pObj->pCutSet = If_ManCutSetFetch( p );
    pObj->pCutSet->nCuts = 0;
    pObj->pCutSet->nCutsMax = p->pPars->nCutsMax;
    return pObj->pCutSet;
}